

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

void __thiscall
wabt::interp::DefinedFunc::DefinedFunc(DefinedFunc *this,Store *store,Ref instance,FuncDesc *desc)

{
  FuncType local_60;
  
  FuncType::FuncType(&local_60,&desc->type);
  Func::Func(&this->super_Func,DefinedFunc,&local_60);
  FuncType::~FuncType(&local_60);
  (this->super_Func).super_Extern.super_Object._vptr_Object =
       (_func_int **)&PTR__DefinedFunc_001f0698;
  (this->instance_).index = instance.index;
  FuncDesc::FuncDesc(&this->desc_,desc);
  return;
}

Assistant:

DefinedFunc::DefinedFunc(Store& store, Ref instance, FuncDesc desc)
    : Func(skind, desc.type), instance_(instance), desc_(desc) {}